

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O2

void __thiscall glslang::TLiveTraverser::pushFunction(TLiveTraverser *this,TString *name)

{
  bool bVar1;
  int iVar2;
  value_type in_RAX;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  uint uVar4;
  TIntermAggregate *candidate;
  value_type local_28;
  
  local_28 = in_RAX;
  iVar2 = (*this->intermediate->treeRoot->_vptr_TIntermNode[6])();
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 400))
                    ((long *)CONCAT44(extraout_var,iVar2));
  uVar4 = 0;
  do {
    if ((ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8) >> 3) <= (ulong)uVar4) {
      return;
    }
    local_28 = (value_type)
               (**(code **)(**(long **)(*(long *)(lVar3 + 8) + (ulong)uVar4 * 8) + 0x30))();
    if ((local_28 != (value_type)0x0) && ((local_28->super_TIntermOperator).op == EOpFunction)) {
      iVar2 = (*(local_28->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x35])(local_28);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_00,iVar2),name);
      if (bVar1) {
        std::__cxx11::
        list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>::push_back
                  (&this->destinations,&local_28);
        return;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void pushFunction(const TString& name)
    {
        TIntermSequence& globals = intermediate.getTreeRoot()->getAsAggregate()->getSequence();
        for (unsigned int f = 0; f < globals.size(); ++f) {
            TIntermAggregate* candidate = globals[f]->getAsAggregate();
            if (candidate && candidate->getOp() == EOpFunction && candidate->getName() == name) {
                destinations.push_back(candidate);
                break;
            }
        }
    }